

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O2

uint highbd_masked_sad_ssse3
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int width,int height)

{
  undefined2 *puVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ushort uVar23;
  undefined1 uVar27;
  short sVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  lVar17 = (long)src8 * 2;
  lVar16 = (long)a8 * 2;
  lVar18 = (long)b8 * 2;
  iVar19 = 0;
  if (height < 1) {
    height = 0;
  }
  auVar21 = (undefined1  [16])0x0;
  for (; iVar19 != height; iVar19 = iVar19 + 1) {
    for (lVar20 = 0; lVar20 < width; lVar20 = lVar20 + 8) {
      auVar22 = *(undefined1 (*) [16])(lVar17 + lVar20 * 2);
      auVar24 = *(undefined1 (*) [16])(lVar16 + lVar20 * 2);
      puVar1 = (undefined2 *)(lVar18 + lVar20 * 2);
      uVar2 = *(ulong *)(m_ptr + lVar20);
      uVar27 = (undefined1)(uVar2 >> 0x38);
      auVar3._8_6_ = 0;
      auVar3._0_8_ = uVar2;
      auVar3[0xe] = uVar27;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar2;
      auVar4[0xc] = (char)(uVar2 >> 0x30);
      auVar4._13_2_ = auVar3._13_2_;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar2;
      auVar5._12_3_ = auVar4._12_3_;
      auVar6._8_2_ = 0;
      auVar6._0_8_ = uVar2;
      auVar6[10] = (char)(uVar2 >> 0x28);
      auVar6._11_4_ = auVar5._11_4_;
      auVar7._8_2_ = 0;
      auVar7._0_8_ = uVar2;
      auVar7._10_5_ = auVar6._10_5_;
      auVar8[8] = (char)(uVar2 >> 0x20);
      auVar8._0_8_ = uVar2;
      auVar8._9_6_ = auVar7._9_6_;
      auVar11._7_8_ = 0;
      auVar11._0_7_ = auVar8._8_7_;
      Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar14._9_6_ = 0;
      auVar14._0_9_ = Var12;
      auVar13._1_10_ = SUB1510(auVar14 << 0x30,5);
      auVar13[0] = (char)(uVar2 >> 0x10);
      auVar15._11_4_ = 0;
      auVar15._0_11_ = auVar13;
      uVar23 = (ushort)uVar2;
      auVar9[2] = (char)(uVar2 >> 8);
      auVar9._0_2_ = uVar23;
      auVar9._3_12_ = SUB1512(auVar15 << 0x20,3);
      auVar10._2_13_ = auVar9._2_13_;
      auVar10._0_2_ = uVar23 & 0xff;
      sVar26 = (short)Var12;
      auVar31._0_12_ = auVar24._0_12_;
      auVar31._12_2_ = auVar24._6_2_;
      auVar31._14_2_ = puVar1[3];
      auVar30._12_4_ = auVar31._12_4_;
      auVar30._0_10_ = auVar24._0_10_;
      auVar30._10_2_ = puVar1[2];
      auVar29._10_6_ = auVar30._10_6_;
      auVar29._0_8_ = auVar24._0_8_;
      auVar29._8_2_ = auVar24._4_2_;
      auVar28._8_8_ = auVar29._8_8_;
      auVar28._6_2_ = puVar1[1];
      auVar28._4_2_ = auVar24._2_2_;
      auVar28._0_2_ = auVar24._0_2_;
      auVar28._2_2_ = *puVar1;
      auVar34._0_12_ = auVar10._0_12_;
      auVar34._12_2_ = sVar26;
      auVar34._14_2_ = 0x40 - sVar26;
      auVar33._12_4_ = auVar34._12_4_;
      auVar33._0_10_ = auVar10._0_10_;
      auVar33._10_2_ = 0x40 - auVar13._0_2_;
      auVar32._10_6_ = auVar33._10_6_;
      auVar32._8_2_ = auVar13._0_2_;
      auVar32._6_2_ = 0x40 - auVar9._2_2_;
      auVar32._4_2_ = auVar9._2_2_;
      auVar32._0_4_ = CONCAT22(0x40 - (uVar23 & 0xff),uVar23) & 0xffff00ff;
      auVar35 = pmaddwd(auVar32,auVar28);
      auVar36._0_4_ = auVar35._0_4_ + 0x20 >> 6;
      auVar36._4_4_ = auVar35._4_4_ + 0x20 >> 6;
      auVar36._8_4_ = auVar35._8_4_ + 0x20 >> 6;
      auVar36._12_4_ = auVar35._12_4_ + 0x20 >> 6;
      auVar35._2_2_ = puVar1[4];
      auVar35._0_2_ = auVar24._8_2_;
      auVar35._4_2_ = auVar24._10_2_;
      auVar35._6_2_ = puVar1[5];
      auVar35._8_2_ = auVar24._12_2_;
      auVar35._10_2_ = puVar1[6];
      auVar35._12_2_ = auVar24._14_2_;
      auVar35._14_2_ = puVar1[7];
      auVar24._2_2_ = 0x40 - auVar8._8_2_;
      auVar24._0_2_ = auVar8._8_2_;
      auVar24._4_2_ = auVar6._10_2_;
      auVar24._6_2_ = 0x40 - auVar6._10_2_;
      auVar24._8_2_ = auVar4._12_2_;
      auVar24._10_2_ = 0x40 - auVar4._12_2_;
      auVar24[0xc] = uVar27;
      auVar24[0xd] = 0;
      auVar24._14_2_ = 0x40 - (auVar3._13_2_ >> 8);
      auVar24 = pmaddwd(auVar24,auVar35);
      auVar25._0_4_ = auVar24._0_4_ + 0x20 >> 6;
      auVar25._4_4_ = auVar24._4_4_ + 0x20 >> 6;
      auVar25._8_4_ = auVar24._8_4_ + 0x20 >> 6;
      auVar25._12_4_ = auVar24._12_4_ + 0x20 >> 6;
      auVar24 = packssdw(auVar36,auVar25);
      auVar37._0_2_ = auVar24._0_2_ - auVar22._0_2_;
      auVar37._2_2_ = auVar24._2_2_ - auVar22._2_2_;
      auVar37._4_2_ = auVar24._4_2_ - auVar22._4_2_;
      auVar37._6_2_ = auVar24._6_2_ - auVar22._6_2_;
      auVar37._8_2_ = auVar24._8_2_ - auVar22._8_2_;
      auVar37._10_2_ = auVar24._10_2_ - auVar22._10_2_;
      auVar37._12_2_ = auVar24._12_2_ - auVar22._12_2_;
      auVar37._14_2_ = auVar24._14_2_ - auVar22._14_2_;
      auVar22 = pabsw(auVar22,auVar37);
      auVar24 = pmaddwd(auVar22,_DAT_0046feb0);
      auVar22._0_4_ = auVar21._0_4_ + auVar24._0_4_;
      auVar22._4_4_ = auVar21._4_4_ + auVar24._4_4_;
      auVar22._8_4_ = auVar21._8_4_ + auVar24._8_4_;
      auVar22._12_4_ = auVar21._12_4_ + auVar24._12_4_;
      auVar21 = auVar22;
    }
    m_ptr = m_ptr + m_stride;
    lVar18 = lVar18 + (long)b_stride * 2;
    lVar16 = lVar16 + (long)a_stride * 2;
    lVar17 = lVar17 + (long)src_stride * 2;
  }
  auVar21 = phaddd(auVar21,auVar21);
  auVar21 = phaddd(auVar21,auVar21);
  return auVar21._0_4_;
}

Assistant:

static inline unsigned int highbd_masked_sad_ssse3(
    const uint8_t *src8, int src_stride, const uint8_t *a8, int a_stride,
    const uint8_t *b8, int b_stride, const uint8_t *m_ptr, int m_stride,
    int width, int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int x, y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i one = _mm_set1_epi16(1);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 8) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      // Zero-extend mask to 16 bits
      const __m128i m = _mm_unpacklo_epi8(
          _mm_loadl_epi64((const __m128i *)&m_ptr[x]), _mm_setzero_si128());
      const __m128i m_inv = _mm_sub_epi16(mask_max, m);

      const __m128i data_l = _mm_unpacklo_epi16(a, b);
      const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
      __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
      pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi16(a, b);
      const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
      __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
      pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      // Note: the maximum value in pred_l/r is (2^bd)-1 < 2^15,
      // so it is safe to do signed saturation here.
      const __m128i pred = _mm_packs_epi32(pred_l, pred_r);
      // There is no 16-bit SAD instruction, so we have to synthesize
      // an 8-element SAD. We do this by storing 4 32-bit partial SADs,
      // and accumulating them at the end
      const __m128i diff = _mm_abs_epi16(_mm_sub_epi16(pred, src));
      res = _mm_add_epi32(res, _mm_madd_epi16(diff, one));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have four 32-bit partial SADs stored in 'res'.
  res = _mm_hadd_epi32(res, res);
  res = _mm_hadd_epi32(res, res);
  int sad = _mm_cvtsi128_si32(res);
  return sad;
}